

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O0

int ddWindowConv4(DdManager *table,int low,int high)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  int *events;
  int newevent;
  int nwin;
  int res;
  int x;
  int high_local;
  int low_local;
  DdManager *table_local;
  
  if (high - low < 3) {
    table_local._4_4_ = ddWindowConv3(table,low,high);
  }
  else {
    iVar2 = high - low;
    iVar3 = iVar2 + -2;
    __ptr = malloc((long)iVar3 << 2);
    if (__ptr == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
      table_local._4_4_ = 0;
    }
    else {
      for (nwin = 0; nwin < iVar3; nwin = nwin + 1) {
        *(undefined4 *)((long)__ptr + (long)nwin * 4) = 1;
      }
      do {
        bVar1 = false;
        for (nwin = 0; nwin < iVar3; nwin = nwin + 1) {
          if (*(int *)((long)__ptr + (long)nwin * 4) != 0) {
            iVar4 = ddPermuteWindow4(table,nwin + low);
            switch(iVar4) {
            case 1:
              break;
            case 2:
              if (nwin < iVar2 + -4) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 2) * 4) = 1;
              }
              if (1 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -2) * 4) = 1;
              }
              bVar1 = true;
              break;
            case 3:
            case 5:
            case 10:
              if (nwin < iVar2 + -4) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 2) * 4) = 1;
              }
              if (nwin < iVar2 + -3) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 1) * 4) = 1;
              }
              if (1 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -2) * 4) = 1;
              }
              if (2 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -3) * 4) = 1;
              }
              bVar1 = true;
              break;
            case 4:
            case 9:
            case 0xe:
              if (nwin < iVar2 + -5) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 3) * 4) = 1;
              }
              if (nwin < iVar2 + -4) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 2) * 4) = 1;
              }
              if (0 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -1) * 4) = 1;
              }
              if (1 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -2) * 4) = 1;
              }
              bVar1 = true;
              break;
            case 6:
            case 0xb:
            case 0xc:
            case 0xf:
            case 0x10:
            case 0x11:
            case 0x12:
            case 0x13:
            case 0x14:
            case 0x15:
            case 0x16:
            case 0x17:
            case 0x18:
              if (nwin < iVar2 + -5) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 3) * 4) = 1;
              }
              if (nwin < iVar2 + -4) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 2) * 4) = 1;
              }
              if (nwin < iVar2 + -3) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 1) * 4) = 1;
              }
              if (0 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -1) * 4) = 1;
              }
              if (1 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -2) * 4) = 1;
              }
              if (2 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -3) * 4) = 1;
              }
              bVar1 = true;
              break;
            case 7:
              if (nwin < iVar2 + -3) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 1) * 4) = 1;
              }
              if (2 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -3) * 4) = 1;
              }
              bVar1 = true;
              break;
            case 8:
              if (nwin < iVar2 + -5) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 3) * 4) = 1;
              }
              if (0 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -1) * 4) = 1;
              }
              bVar1 = true;
              break;
            case 0xd:
              if (nwin < iVar2 + -5) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 3) * 4) = 1;
              }
              if (nwin < iVar2 + -3) {
                *(undefined4 *)((long)__ptr + (long)(nwin + 1) * 4) = 1;
              }
              if (0 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -1) * 4) = 1;
              }
              if (2 < nwin) {
                *(undefined4 *)((long)__ptr + (long)(nwin + -3) * 4) = 1;
              }
              bVar1 = true;
              break;
            default:
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              return 0;
            }
            *(undefined4 *)((long)__ptr + (long)nwin * 4) = 0;
          }
        }
      } while (bVar1);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      table_local._4_4_ = 1;
    }
  }
  return table_local._4_4_;
}

Assistant:

static int
ddWindowConv4(
  DdManager * table,
  int  low,
  int  high)
{
    int x;
    int res;
    int nwin;
    int newevent;
    int *events;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 3) return(ddWindowConv3(table,low,high));

    nwin = high-low-2;
    events = ABC_ALLOC(int,nwin);
    if (events == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (x=0; x<nwin; x++) {
        events[x] = 1;
    }

    do {
        newevent = 0;
        for (x=0; x<nwin; x++) {
            if (events[x]) {
                res = ddPermuteWindow4(table,x+low);
                switch (res) {
                case ABCD:
                    break;
                case BACD:
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 2)          events[x-3] = 1;
                    newevent = 1;
                    break;
                case BADC:
                    if (x < nwin-3)     events[x+3] = 1;
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    if (x > 2)          events[x-3] = 1;
                    newevent = 1;
                    break;
                case ABDC:
                    if (x < nwin-3)     events[x+3] = 1;
                    if (x > 0)          events[x-1] = 1;
                    newevent = 1;
                    break;
                case ADBC:
                case ADCB:
                case ACDB:
                    if (x < nwin-3)     events[x+3] = 1;
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x > 0)          events[x-1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    newevent = 1;
                    break;
                case DACB:
                case DABC:
                case DBAC:
                case BDAC:
                case BDCA:
                case DBCA:
                case DCBA:
                case DCAB:
                case CDAB:
                case CDBA:
                case CBDA:
                case BCDA:
                case CADB:
                    if (x < nwin-3)     events[x+3] = 1;
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    if (x > 2)          events[x-3] = 1;
                    newevent = 1;
                    break;
                case BCAD:
                case CBAD:
                case CABD:
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    if (x > 2)          events[x-3] = 1;
                    newevent = 1;
                    break;
                case ACBD:
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x > 1)          events[x-2] = 1;
                    newevent = 1;
                    break;
                default:
                    ABC_FREE(events);
                    return(0);
                }
                events[x] = 0;
#ifdef DD_STATS
                if (res == ABCD) {
                    (void) fprintf(table->out,"=");
                } else {
                    (void) fprintf(table->out,"-");
                }
                fflush(table->out);
#endif
            }
        }
#ifdef DD_STATS
        if (newevent) {
            (void) fprintf(table->out,"|");
            fflush(table->out);
        }
#endif
    } while (newevent);

    ABC_FREE(events);

    return(1);

}